

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O1

shared_ptr<ccs::SearchState> __thiscall
ccs::SearchState::newChild(SearchState *this,shared_ptr<const_ccs::SearchState> *parent,Key *key)

{
  byte bVar1;
  bool bVar2;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  byte bVar4;
  element_type *priorState;
  shared_ptr<ccs::SearchState> sVar5;
  
  this_00 = (element_type *)operator_new(0xf8);
  SearchState((SearchState *)this_00,parent,key);
  (this->root).super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ccs::SearchState*>
            (&(this->root).super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SearchState *)this_00);
  priorState = (parent->super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  _Var3._M_pi = extraout_RDX;
  if (priorState != (element_type *)0x0) {
    bVar4 = 0;
    do {
      do {
        bVar2 = extendWith((SearchState *)
                           (this->root).
                           super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           priorState);
        bVar4 = bVar4 | bVar2;
        priorState = (priorState->parent).
                     super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      } while (priorState != (element_type *)0x0);
      priorState = (parent->super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
      bVar1 = bVar4 & priorState != (element_type *)0x0;
      bVar4 = 0;
      _Var3._M_pi = extraout_RDX_00;
    } while (bVar1 != 0);
  }
  sVar5.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::SearchState>)
         sVar5.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SearchState> SearchState::newChild(
    const std::shared_ptr<const SearchState> &parent, const Key &key) {
  std::shared_ptr<SearchState> searchState(new SearchState(parent, key));

  bool constraintsChanged;
  do {
    constraintsChanged = false;
    const SearchState *p = parent.get();
    while (p) {
      constraintsChanged |= searchState->extendWith(*p);
      p = p->parent.get();
    }
  } while (constraintsChanged);

  return searchState;
}